

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CodedInputStream::RecomputeBufferLimits(CodedInputStream *this)

{
  uint8 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  puVar1 = this->buffer_end_;
  this->buffer_end_ = puVar1 + this->buffer_size_after_limit_;
  iVar2 = this->current_limit_;
  if (this->total_bytes_limit_ < this->current_limit_) {
    iVar2 = this->total_bytes_limit_;
  }
  iVar3 = this->total_bytes_read_ - iVar2;
  iVar4 = 0;
  if (iVar3 != 0 && iVar2 <= this->total_bytes_read_) {
    this->buffer_end_ = puVar1 + this->buffer_size_after_limit_ + -(long)iVar3;
    iVar4 = iVar3;
  }
  this->buffer_size_after_limit_ = iVar4;
  return;
}

Assistant:

inline void CodedInputStream::RecomputeBufferLimits() {
  buffer_end_ += buffer_size_after_limit_;
  int closest_limit = min(current_limit_, total_bytes_limit_);
  if (closest_limit < total_bytes_read_) {
    // The limit position is in the current buffer.  We must adjust
    // the buffer size accordingly.
    buffer_size_after_limit_ = total_bytes_read_ - closest_limit;
    buffer_end_ -= buffer_size_after_limit_;
  } else {
    buffer_size_after_limit_ = 0;
  }
}